

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O0

void WritePTLen(INT32 Number,INT32 nbit,INT32 Special)

{
  uint Value;
  int iVar1;
  bool bVar2;
  int local_18;
  INT32 Index3;
  INT32 Index;
  INT32 Special_local;
  INT32 nbit_local;
  INT32 Number_local;
  
  Special_local = Number;
  while( true ) {
    bVar2 = false;
    if (0 < Special_local) {
      bVar2 = mPTLen[Special_local + -1] == '\0';
    }
    if (!bVar2) break;
    Special_local = Special_local + -1;
  }
  PutBits(nbit,Special_local);
  local_18 = 0;
  while (local_18 < Special_local) {
    iVar1 = local_18 + 1;
    Value = (uint)mPTLen[local_18];
    if (Value < 7) {
      PutBits(3,Value);
    }
    else {
      PutBits(Value - 3,(1 << (mPTLen[local_18] - 3 & 0x1f)) - 2);
    }
    local_18 = iVar1;
    if (iVar1 == Special) {
      while( true ) {
        bVar2 = false;
        if (local_18 < 6) {
          bVar2 = mPTLen[local_18] == '\0';
        }
        if (!bVar2) break;
        local_18 = local_18 + 1;
      }
      PutBits(2,local_18 - 3U & 3);
    }
  }
  return;
}

Assistant:

STATIC 
VOID 
WritePTLen (
  IN INT32 n, 
  IN INT32 nbit, 
  IN INT32 Special
  )
/*++

Routine Description:

  Outputs the code length array for the Extra Set or the Position Set.
  
Arguments:

  n       - the number of symbols
  nbit    - the number of bits needed to represent 'n'
  Special - the special symbol that needs to be take care of
  
Returns: (VOID)

--*/
{
  INT32 i, k;

  while (n > 0 && mPTLen[n - 1] == 0) {
    n--;
  }
  PutBits(nbit, n);
  i = 0;
  while (i < n) {
    k = mPTLen[i++];
    if (k <= 6) {
      PutBits(3, k);
    } else {
      PutBits(k - 3, (1U << (k - 3)) - 2);
    }
    if (i == Special) {
      while (i < 6 && mPTLen[i] == 0) {
        i++;
      }
      PutBits(2, (i - 3) & 3);
    }
  }
}